

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_http_variable_value_t * ngx_http_get_indexed_variable(ngx_http_request_t *r,ngx_uint_t index)

{
  long lVar1;
  long lVar2;
  ngx_http_core_main_conf_t *cmcf;
  ngx_http_variable_t *v;
  ngx_uint_t index_local;
  ngx_http_request_t *r_local;
  
  if (index < *(ulong *)((long)r->main_conf[ngx_http_core_module.ctx_index] + 0x68)) {
    if (((*(uint *)(r->variables + index) >> 0x1e & 1) == 0) &&
       ((*(uint *)(r->variables + index) >> 0x1c & 1) == 0)) {
      lVar1 = *(long *)((long)r->main_conf[ngx_http_core_module.ctx_index] + 0x60);
      if (ngx_http_variable_depth == 0) {
        if (3 < r->connection->log->log_level) {
          ngx_log_error_core(4,r->connection->log,0,"cycle while evaluating variable \"%V\"",
                             lVar1 + index * 0x38);
        }
        r_local = (ngx_http_request_t *)0x0;
      }
      else {
        ngx_http_variable_depth = ngx_http_variable_depth - 1;
        lVar2 = (**(code **)(lVar1 + index * 0x38 + 0x18))
                          (r,r->variables + index,*(undefined8 *)(lVar1 + index * 0x38 + 0x20));
        if (lVar2 == 0) {
          ngx_http_variable_depth = ngx_http_variable_depth + 1;
          if ((*(ulong *)(lVar1 + index * 0x38 + 0x28) & 2) != 0) {
            *(uint *)(r->variables + index) =
                 *(uint *)(r->variables + index) & 0xdfffffff | 0x20000000;
          }
          r_local = (ngx_http_request_t *)(r->variables + index);
        }
        else {
          ngx_http_variable_depth = ngx_http_variable_depth + 1;
          *(uint *)(r->variables + index) = *(uint *)(r->variables + index) & 0xefffffff;
          *(uint *)(r->variables + index) =
               *(uint *)(r->variables + index) & 0xbfffffff | 0x40000000;
          r_local = (ngx_http_request_t *)0x0;
        }
      }
    }
    else {
      r_local = (ngx_http_request_t *)(r->variables + index);
    }
  }
  else {
    if (1 < r->connection->log->log_level) {
      ngx_log_error_core(2,r->connection->log,0,"unknown variable index: %ui",index);
    }
    r_local = (ngx_http_request_t *)0x0;
  }
  return (ngx_http_variable_value_t *)r_local;
}

Assistant:

ngx_http_variable_value_t *
ngx_http_get_indexed_variable(ngx_http_request_t *r, ngx_uint_t index)
{
    ngx_http_variable_t        *v;
    ngx_http_core_main_conf_t  *cmcf;

    cmcf = ngx_http_get_module_main_conf(r, ngx_http_core_module);

    if (cmcf->variables.nelts <= index) {
        ngx_log_error(NGX_LOG_ALERT, r->connection->log, 0,
                      "unknown variable index: %ui", index);
        return NULL;
    }

    if (r->variables[index].not_found || r->variables[index].valid) {
        return &r->variables[index];
    }

    v = cmcf->variables.elts;

    if (ngx_http_variable_depth == 0) {
        ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                      "cycle while evaluating variable \"%V\"",
                      &v[index].name);
        return NULL;
    }

    ngx_http_variable_depth--;

    if (v[index].get_handler(r, &r->variables[index], v[index].data)
        == NGX_OK)
    {
        ngx_http_variable_depth++;

        if (v[index].flags & NGX_HTTP_VAR_NOCACHEABLE) {
            r->variables[index].no_cacheable = 1;
        }

        return &r->variables[index];
    }

    ngx_http_variable_depth++;

    r->variables[index].valid = 0;
    r->variables[index].not_found = 1;

    return NULL;
}